

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

bool __thiscall
SslUdpSocketImpl::CreateClientSide
          (SslUdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szDestAddr,char *szIpToBind
          )

{
  bool bVar1;
  pointer pSVar2;
  type this_00;
  SSL *__val;
  wchar_t *pOut;
  type szBuffer;
  __int_type local_1a0;
  size_t len;
  __array temp;
  size_t nOutDataSize;
  undefined1 local_180 [7];
  bool bNewData;
  unique_lock<std::mutex> lock;
  wstring local_150;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_130;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_110;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  uint local_ac;
  int local_a8;
  int iError;
  int iSslInit;
  SslUdpSocketImpl *local_98;
  offset_in_BaseSocketImpl_to_subr local_90 [2];
  type local_80;
  function<void_()> local_68;
  byte local_39;
  char *pcStack_38;
  bool bRet;
  char *szIpToBind_local;
  char *szDestAddr_local;
  undefined8 uStack_20;
  uint16_t sPort_local;
  char *szIpToWhere_local;
  SslUdpSocketImpl *this_local;
  
  pcStack_38 = szIpToBind;
  szIpToBind_local = szDestAddr;
  szDestAddr_local._6_2_ = sPort;
  uStack_20 = szIpToWhere;
  szIpToWhere_local = (char *)this;
  std::__cxx11::string::operator=((string *)&this->m_strDestAddr,szDestAddr);
  local_39 = UdpSocketImpl::Create
                       (&this->super_UdpSocketImpl,(char *)uStack_20,szDestAddr_local._6_2_,
                        pcStack_38);
  if ((bool)local_39) {
    std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslUdpContext&>
              ((SslUdpContext *)&stack0xffffffffffffffb8);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    operator=(&this->m_pSslCon,
              (unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)&stack0xffffffffffffffb8);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 *)&stack0xffffffffffffffb8);
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    local_90[1] = 0;
    local_90[0] = 0x11;
    local_98 = this;
    std::bind<void(BaseSocketImpl::*)(),SslUdpSocketImpl*>(&local_80,local_90,&local_98);
    std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslUdpSocketImpl*))()>,void>
              ((function<void()> *)&local_68,&local_80);
    OpenSSLWrapper::SslConnection::SetErrorCb(pSVar2,&local_68);
    std::function<void_()>::~function(&local_68);
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::SSLSetConnectState(pSVar2);
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    local_a8 = OpenSSLWrapper::SslConnection::SSLDoHandshake(pSVar2);
    if (local_a8 < 1) {
      pSVar2 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      local_ac = OpenSSLWrapper::SslConnection::SSLGetError(pSVar2,local_a8);
      if (local_ac != 2) {
        (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iError = local_ac | 0x80000000;
        (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xf;
        std::__cxx11::to_wstring(&local_150,local_ac);
        std::operator+(&local_130,L"SSL_error after SSL_Handshake: ",&local_150);
        std::operator+(&local_110,&local_130,L" on ssl context: ");
        this_00 = std::
                  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                  ::operator*(&this->m_pSslCon);
        __val = OpenSSLWrapper::SslConnection::operator()(this_00);
        std::__cxx11::to_wstring((wstring *)&lock._M_owns,(unsigned_long)__val);
        std::operator+(&local_f0,&local_110,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&lock._M_owns);
        std::operator+(&local_d0,&local_f0,L"\r\n");
        pOut = (wchar_t *)std::__cxx11::wstring::c_str();
        OutputDebugString(pOut);
        std::__cxx11::wstring::~wstring((wstring *)&local_d0);
        std::__cxx11::wstring::~wstring((wstring *)&local_f0);
        std::__cxx11::wstring::~wstring((wstring *)&lock._M_owns);
        std::__cxx11::wstring::~wstring((wstring *)&local_110);
        std::__cxx11::wstring::~wstring((wstring *)&local_130);
        std::__cxx11::wstring::~wstring((wstring *)&local_150);
        (*(this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])();
        return false;
      }
      local_ac = 2;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_180,&this->m_mxEnDecode);
    bVar1 = false;
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
    while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      std::make_unique<unsigned_char[]>((size_t)&len);
      pSVar2 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      szBuffer = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            &len,0);
      local_1a0 = OpenSSLWrapper::SslConnection::SslGetOutData
                            (pSVar2,szBuffer,
                             (size_t)temp._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      if (local_1a0 != 0) {
        std::mutex::lock(&(this->super_UdpSocketImpl).m_mxOutDeque);
        std::__atomic_base<unsigned_long>::operator+=
                  (&(this->super_UdpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                   local_1a0);
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                    *)&(this->super_UdpSocketImpl).m_quOutData,
                   (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len,
                   &local_1a0,&this->m_strDestAddr);
        std::mutex::unlock(&(this->super_UdpSocketImpl).m_mxOutDeque);
        bVar1 = true;
      }
      pSVar2 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_180);
    if (bVar1) {
      UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_180);
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool SslUdpSocketImpl::CreateClientSide(const char* const szIpToWhere, const uint16_t sPort, const char* const szDestAddr, const char* const szIpToBind/* = nullptr*/)
{
    m_strDestAddr = szDestAddr;
    const bool bRet = UdpSocketImpl::Create(szIpToWhere, sPort, szIpToBind);
    if (bRet == true)
    {
        m_pSslCon = make_unique<SslConnection>(m_pUdpCtx);
        m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));

        //SSL_set_info_callback((*m_pSslCon)(), ssl_info_callbackClient);

        m_pSslCon->SSLSetConnectState();

        const int iSslInit = m_pSslCon->SSLDoHandshake();
        if (iSslInit <= 0)
        {
            const int iError = m_pSslCon->SSLGetError(iSslInit);
            if (iError != SSL_ERROR_WANT_READ)
            {
                m_iError = 0x80000000 | iError;
                m_iErrLoc = 15;
                OutputDebugString(wstring(L"SSL_error after SSL_Handshake: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
                Close();
                return false;
            }
        }

        unique_lock<mutex> lock(m_mxEnDecode);
        bool bNewData = false;

        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len, m_strDestAddr);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }

        lock.unlock();

        if (bNewData == true)
            TriggerWriteThread();

    }
    return bRet;
}